

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerQueue.h
# Opt level: O3

void __thiscall
WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
::WaitTillDone(WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *this)

{
  int iVar1;
  int *piVar2;
  timespec local_28;
  
  if ((*(int *)(this + 0xac) != 0) || (*(long *)(this + 0xe0) != *(long *)(this + 0xc0))) {
    do {
      local_28.tv_sec = 0;
      local_28.tv_nsec = 50000000;
      do {
        iVar1 = nanosleep(&local_28,&local_28);
        if (iVar1 != -1) break;
        piVar2 = __errno_location();
      } while (*piVar2 == 4);
    } while ((*(int *)(this + 0xac) != 0) || (*(long *)(this + 0xe0) != *(long *)(this + 0xc0)));
  }
  return;
}

Assistant:

void WaitTillDone() {
    while( !Done() ) {
      std::this_thread::sleep_for( std::chrono::milliseconds( 50 ) );
    }
  }